

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  bool bVar1;
  uint32_t uVar2;
  Nullable<const_char_*> failure_msg;
  char *pcVar3;
  LogMessage *pLVar4;
  int line;
  LogMessage local_40;
  Descriptor *local_30;
  
  local_30 = message_type;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    failure_msg = "field->is_repeated()";
    line = 0xd55;
LAB_0021b864:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpp_type) &&
     ((cpp_type != CPPTYPE_INT32 ||
      (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != CPPTYPE_ENUM)))
     ) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd58,
               "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
              );
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_40,
                        (char (*) [63])
                        "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [65])
                               "the actual field type (for enums T should be the generated enum ");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar4,(char (*) [18])"type or int32_t).");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  if (message_type != (Descriptor *)0x0) {
    local_40._0_8_ = FieldDescriptor::message_type(field);
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                            (&local_30,(Descriptor **)&local_40,
                             "message_type == field->message_type()");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0xd5d;
      goto LAB_0021b864;
    }
  }
  if ((field->field_0x1 & 8) == 0) {
    pcVar3 = GetRawNonOneof<char>(this,message,field);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pcVar3 = (char *)internal::ExtensionSet::GetRawRepeatedField
                               ((ExtensionSet *)
                                ((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar2),field->number_,internal::kZeroBuffer);
  }
  return pcVar3;
}

Assistant:

const void* Reflection::RepeatedFieldData(
    const Message& message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type, const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    return &GetRawNonOneof<char>(message, field);
  }
}